

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FixBoundsPS::FixBoundsPS
          (FixBoundsPS *this,SPxLPBase<double> *lp,int j,double val,
          shared_ptr<soplex::Tolerances> *tols)

{
  bool bVar1;
  double *pdVar2;
  SPxInternalCodeException *this_00;
  undefined4 in_EDX;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  SPxLPBase<double> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  allocator *paVar3;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffed0;
  double dVar4;
  char *in_stack_fffffffffffffed8;
  PostStep *in_stack_fffffffffffffee0;
  allocator local_69;
  string local_68 [84];
  undefined4 local_14;
  
  local_14 = in_EDX;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffec0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x288a9c);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x288ab2);
  PostStep::PostStep(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                     (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x288afb);
  *in_RDI = (long)&PTR__FixBoundsPS_00897788;
  *(undefined4 *)(in_RDI + 5) = local_14;
  SPxLPBase<double>::lower(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  SPxLPBase<double>::upper(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  (**(code **)(*in_RDI + 0x30))();
  bVar1 = EQrel<double,double,double>
                    ((double)in_stack_fffffffffffffec0,
                     (double)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     1.31283568072017e-317);
  if (bVar1) {
    *(undefined4 *)((long)in_RDI + 0x2c) = 2;
  }
  else {
    SPxLPBase<double>::lower(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    (**(code **)(*in_RDI + 0x30))();
    bVar1 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffec0,
                       (double)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       1.31294239889967e-317);
    if (bVar1) {
      *(undefined4 *)((long)in_RDI + 0x2c) = 1;
    }
    else {
      SPxLPBase<double>::upper(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      (**(code **)(*in_RDI + 0x30))();
      bVar1 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffec0,
                         (double)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         1.31301206215574e-317);
      if (!bVar1) {
        pdVar2 = SPxLPBase<double>::lower(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        dVar4 = *pdVar2;
        pdVar2 = (double *)infinity();
        if (dVar4 <= -*pdVar2) {
          pdVar2 = SPxLPBase<double>::upper(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          dVar4 = *pdVar2;
          pdVar2 = (double *)infinity();
          if (*pdVar2 <= dVar4) {
            *(undefined4 *)((long)in_RDI + 0x2c) = 3;
            return;
          }
        }
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        paVar3 = &local_69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"XMAISM14 This should never happen.",paVar3);
        SPxInternalCodeException::SPxInternalCodeException
                  (this_00,(string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      }
      *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    }
  }
  return;
}

Assistant:

FixBoundsPS(const SPxLPBase<R>& lp, int j, R val, std::shared_ptr<Tolerances> tols)
         : PostStep("FixBounds", tols, lp.nRows(), lp.nCols())
         , m_j(j)
      {
         if(EQrel(lp.lower(j), lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::FIXED;
         else if(EQrel(val, lp.lower(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_LOWER;
         else if(EQrel(val, lp.upper(j), this->feastol()))
            m_status = SPxSolverBase<R>::ON_UPPER;
         else if(lp.lower(j) <= R(-infinity) && lp.upper(j) >= R(infinity))
            m_status = SPxSolverBase<R>::ZERO;
         else
         {
            throw SPxInternalCodeException("XMAISM14 This should never happen.");
         }
      }